

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

void matd_add_inplace(matd_t *a,matd_t *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x139,"void matd_add_inplace(matd_t *, const matd_t *)");
  }
  if (b == (matd_t *)0x0) {
    __assert_fail("b != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x13a,"void matd_add_inplace(matd_t *, const matd_t *)");
  }
  uVar1 = a->nrows;
  if (uVar1 != b->nrows) {
    __assert_fail("a->nrows == b->nrows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x13b,"void matd_add_inplace(matd_t *, const matd_t *)");
  }
  uVar2 = a->ncols;
  uVar3 = b->ncols;
  if (uVar2 == uVar3) {
    if ((uVar2 | uVar1) < 2) {
      a[1] = (matd_t)((double)b[1] + (double)a[1]);
    }
    else if (uVar1 != 0) {
      uVar6 = 0;
      uVar5 = 0;
      uVar9 = 0;
      uVar4 = (ulong)uVar2;
      uVar8 = uVar5;
      uVar7 = uVar6;
      do {
        for (; uVar4 != 0; uVar4 = uVar4 - 1) {
          a[(ulong)uVar5 + 1] = (matd_t)((double)b[(ulong)uVar6 + 1] + (double)a[(ulong)uVar5 + 1]);
          uVar5 = uVar5 + 1;
          uVar6 = uVar6 + 1;
        }
        uVar9 = uVar9 + 1;
        uVar5 = uVar8 + uVar2;
        uVar6 = uVar7 + uVar3;
        uVar4 = (ulong)uVar2;
        uVar8 = uVar5;
        uVar7 = uVar6;
      } while (uVar9 != uVar1);
    }
    return;
  }
  __assert_fail("a->ncols == b->ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x13c,"void matd_add_inplace(matd_t *, const matd_t *)");
}

Assistant:

void matd_add_inplace(matd_t *a, const matd_t *b)
{
    assert(a != NULL);
    assert(b != NULL);
    assert(a->nrows == b->nrows);
    assert(a->ncols == b->ncols);

    if (matd_is_scalar(a)) {
        a->data[0] += b->data[0];
        return;
    }

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(a, i, j) += MATD_EL(b, i, j);
        }
    }
}